

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

void __thiscall SQFuncState::DiscardTarget(SQFuncState *this)

{
  SQUnsignedInteger SVar1;
  SQInstruction *pSVar2;
  ulong uVar3;
  
  uVar3 = PopTarget(this);
  SVar1 = (this->_instructions)._size;
  if ((0 < (long)SVar1) && (this->_optimization == true)) {
    pSVar2 = (this->_instructions)._vals;
    if ((pSVar2[SVar1 - 1].op < 0x20) &&
       (((0x80002840U >> (pSVar2[SVar1 - 1].op & 0x1f) & 1) != 0 &&
        (uVar3 == pSVar2[SVar1 - 1]._arg0)))) {
      pSVar2[SVar1 - 1]._arg0 = 0xff;
    }
  }
  return;
}

Assistant:

void SQFuncState::DiscardTarget()
{
    SQInteger discardedtarget = PopTarget();
    SQInteger size = _instructions.size();
    if(size > 0 && _optimization){
        SQInstruction &pi = _instructions[size-1];//previous instruction
        switch(pi.op) {
        case _OP_SET:case _OP_NEWSLOT:case _OP_SETOUTER:case _OP_CALL:
            if(pi._arg0 == discardedtarget) {
                pi._arg0 = 0xFF;
            }
        }
    }
}